

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Headers.cpp
# Opt level: O2

void __thiscall KDReports::Test::testEvenOdd(Test *this)

{
  char cVar1;
  void *t2;
  void *pvVar2;
  void *pvVar3;
  int iVar4;
  bool bVar5;
  Report report;
  long local_20;
  
  KDReports::Report::Report(&report,(QObject *)0x0);
  t2 = (void *)KDReports::Report::header(&report,2);
  pvVar2 = (void *)KDReports::Report::header(&report,4);
  if (*(long *)(local_20 + 0x78) == 0) {
    bVar5 = false;
  }
  else {
    bVar5 = *(long *)(*(long *)(local_20 + 0x78) + 0x30) != 0;
  }
  cVar1 = QTest::qVerify(bVar5,"!headers.isEmpty()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/Headers/Headers.cpp"
                         ,0x34);
  if (cVar1 != '\0') {
    iVar4 = (int)local_20 + 0x78;
    pvVar3 = (void *)KDReports::HeaderMap::headerForPage(iVar4,1);
    bVar5 = QTest::compare_ptr_helper
                      (pvVar3,pvVar2,"headers.headerForPage(1, 2)","&oddHeader",
                       "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/Headers/Headers.cpp"
                       ,0x35);
    if (bVar5) {
      pvVar3 = (void *)KDReports::HeaderMap::headerForPage(iVar4,2);
      bVar5 = QTest::compare_ptr_helper
                        (pvVar3,t2,"headers.headerForPage(2, 2)","&evenHeader",
                         "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/Headers/Headers.cpp"
                         ,0x36);
      if (bVar5) {
        pvVar3 = (void *)KDReports::HeaderMap::headerForPage(iVar4,1);
        bVar5 = QTest::compare_ptr_helper
                          (pvVar3,pvVar2,"headers.headerForPage(1, 1)","&oddHeader",
                           "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/Headers/Headers.cpp"
                           ,0x37);
        if (bVar5) {
          pvVar2 = (void *)KDReports::HeaderMap::headerForPage(iVar4,4);
          QTest::compare_ptr_helper
                    (pvVar2,t2,"headers.headerForPage(4, 4)","&evenHeader",
                     "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/Headers/Headers.cpp"
                     ,0x38);
        }
      }
    }
  }
  KDReports::Report::~Report(&report);
  return;
}

Assistant:

void testEvenOdd()
    {
        Report report;
        Header &evenHeader = report.header(EvenPages);
        Header &oddHeader = report.header(OddPages);
        HeaderMap &headers = report.d->m_headers;
        QVERIFY(!headers.isEmpty());
        QCOMPARE(headers.headerForPage(1, 2), &oddHeader);
        QCOMPARE(headers.headerForPage(2, 2), &evenHeader);
        QCOMPARE(headers.headerForPage(1, 1), &oddHeader);
        QCOMPARE(headers.headerForPage(4, 4), &evenHeader);
    }